

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

string * __thiscall
despot::SemiChainBelief::text_abi_cxx11_(string *__return_storage_ptr__,SemiChainBelief *this)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int local_1a8;
  int r;
  int local_194;
  ostringstream local_190 [4];
  int a;
  ostringstream oss;
  SemiChainBelief *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->alpha_);
    if (sVar1 <= (ulong)(long)local_194) break;
    poVar2 = (ostream *)std::ostream::operator<<(local_190,local_194);
    std::operator<<(poVar2," ->");
    local_1a8 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->alpha_,(long)local_194);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      if (sVar1 <= (ulong)(long)local_1a8) break;
      poVar2 = std::operator<<((ostream *)local_190," ");
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->alpha_,(long)local_194);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_1a8);
      std::ostream::operator<<(poVar2,*pvVar4);
      local_1a8 = local_1a8 + 1;
    }
    std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
    local_194 = local_194 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string SemiChainBelief::text() const {
	ostringstream oss;
	for (int a = 0; a < alpha_.size(); a++) {
		oss << a << " ->";
		for (int r = 0; r < alpha_[a].size(); r++)
			oss << " " << alpha_[a][r];
		oss << endl;
	}
	return oss.str();
}